

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O0

void Qentem::Memory::
     Sort<true,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
               (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *arr,uint start,uint end)

{
  bool bVar1;
  uint local_28;
  uint local_24;
  uint offset;
  uint index;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *item;
  uint end_local;
  uint start_local;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *arr_local;
  
  if (start != end) {
    local_24 = start;
    for (local_28 = start + 1; local_28 < end; local_28 = local_28 + 1) {
      bVar1 = HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>::operator<
                        (arr + local_28,arr + start);
      if (bVar1) {
        local_24 = local_24 + 1;
        Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>
                  (arr + local_24,arr + local_28);
      }
    }
    if (local_24 != start) {
      Swap<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(arr + local_24,arr + start);
    }
    Sort<true,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
              (arr,start,local_24);
    Sort<true,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>,unsigned_int>
              (arr,local_24 + 1,end);
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}